

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O0

int greatest_do_assert_equal_t(void *expd,void *got,greatest_type_info *type_info,void *udata)

{
  int eq;
  void *udata_local;
  greatest_type_info *type_info_local;
  void *got_local;
  void *expd_local;
  
  if ((type_info == (greatest_type_info *)0x0) || (type_info->equal == (greatest_equal_cb *)0x0)) {
    expd_local._4_4_ = 0;
  }
  else {
    expd_local._4_4_ = (*type_info->equal)(expd,got,udata);
    if ((expd_local._4_4_ == 0) && (type_info->print != (greatest_printf_cb *)0x0)) {
      fprintf(_stdout,"\nExpected: ");
      (*type_info->print)(expd,udata);
      fprintf(_stdout,"\n     Got: ");
      (*type_info->print)(got,udata);
      fprintf(_stdout,"\n");
    }
  }
  return expd_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}